

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O1

size_t __thiscall
unittest_drop_unknown_fields::FooWithExtraFields::ByteSizeLong(FooWithExtraFields *this)

{
  long lVar1;
  anon_union_20_1_493b367e_for_FooWithExtraFields_11 aVar2;
  ulong uVar3;
  size_t sVar4;
  
  aVar2 = this->field_0;
  if (((undefined1  [20])aVar2 & (undefined1  [20])0x7) == (undefined1  [20])0x0) {
    sVar4 = 0;
  }
  else {
    if ((((undefined1  [20])aVar2 & (undefined1  [20])0x1) == (undefined1  [20])0x0) ||
       (uVar3 = (ulong)(this->field_0)._impl_.int32_value_, uVar3 == 0)) {
      sVar4 = 0;
    }
    else {
      uVar3 = uVar3 | 1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = (size_t)((int)lVar1 * 9 + 0x89U >> 6);
    }
    if ((((undefined1  [20])aVar2 & (undefined1  [20])0x2) != (undefined1  [20])0x0) &&
       (uVar3 = (ulong)(this->field_0)._impl_.enum_value_, uVar3 != 0)) {
      uVar3 = uVar3 | 1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((((undefined1  [20])aVar2 & (undefined1  [20])0x4) != (undefined1  [20])0x0) &&
       (uVar3 = (ulong)(this->field_0)._impl_.extra_int32_value_, uVar3 != 0)) {
      uVar3 = uVar3 | 1;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}